

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

natwm_error parser_create_variable(parser *parser)

{
  char *__ptr;
  char *value_00;
  natwm_error nVar1;
  char *local_30;
  char *key;
  config_value *value;
  
  parser_increment(parser);
  local_30 = (char *)0x0;
  key = (char *)0x0;
  nVar1 = parser_read_item(parser,&local_30,(config_value **)&key);
  value_00 = key;
  __ptr = local_30;
  if (nVar1 == NO_ERROR) {
    nVar1 = map_insert(parser->variables,local_30,key);
    if (nVar1 == NO_ERROR) {
      nVar1 = NO_ERROR;
    }
    else {
      free(__ptr);
      config_value_destroy((config_value *)value_00);
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error parser_create_variable(struct parser *parser)
{
        // Skip VARIABLE_START
        parser_increment(parser);

        enum natwm_error err = GENERIC_ERROR;
        char *key = NULL;
        struct config_value *value = NULL;

        err = parser_read_item(parser, &key, &value);

        if (err != NO_ERROR) {
                return err;
        }

        err = map_insert(parser->variables, key, value);

        if (err != NO_ERROR) {
                free(key);
                config_value_destroy(value);

                return err;
        }

        return NO_ERROR;
}